

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.c
# Opt level: O2

long mk_date(long index,date_t *d)

{
  char *__dest;
  int month;
  int day;
  int iVar1;
  int iVar2;
  tm *ptVar3;
  size_t sVar4;
  int iVar5;
  long lVar6;
  time_t numDateTime;
  
  numDateTime = index * 0x15180 + 0x2960079d;
  ptVar3 = localtime(&numDateTime);
  lVar6 = ((long)ptVar3->tm_wday + 1) % 7;
  d->daynuminweek = (int)lVar6 + 1;
  iVar2 = ptVar3->tm_mon;
  d->monthnuminyear = iVar2 + 1;
  strncpy(d->dayofweek,weekday_names[lVar6],10);
  __dest = d->month;
  strncpy(__dest,month_names[iVar2],10);
  iVar5 = ptVar3->tm_year + 0x76c;
  d->year = iVar5;
  d->daynuminmonth = ptVar3->tm_mday;
  d->yearmonthnum = iVar5 * 100 + iVar2 + 1;
  sprintf(d->yearmonth,"%.3s%d",__dest);
  sprintf(d->date,"%s %d, %d",__dest,(ulong)(uint)d->daynuminmonth,(ulong)(uint)d->year);
  iVar2 = d->year;
  iVar5 = d->daynuminweek;
  month = d->monthnuminyear;
  day = d->daynuminmonth;
  d->datekey = (long)(month * 100 + iVar2 * 10000 + day);
  iVar1 = ptVar3->tm_yday + 1;
  d->daynuminyear = iVar1;
  d->weeknuminyear = iVar1 / 7 + 1;
  d->lastdayinweekfl[0] = (iVar5 == 7) + '0';
  d->lastdayinweekfl[1] = '\0';
  iVar2 = is_last_day_in_month(iVar2,month,day);
  d->lastdayinmonthfl[0] = iVar2 == 0 ^ 0x31;
  d->lastdayinmonthfl[1] = '\0';
  d->weekdayfl[0] = (iVar5 == 1 || iVar5 == 7) ^ 0x31;
  d->weekdayfl[1] = '\0';
  gen_season(d->sellingseason,month,day);
  sVar4 = strlen(d->sellingseason);
  d->slen = (int)sVar4;
  gen_holiday_fl(d->holidayfl,d->monthnuminyear,d->daynuminmonth);
  return 0;
}

Assistant:

long
mk_date(long index,date_t *d)
{
    long espan = (index-1)*60*60*24;
    
    time_t numDateTime = D_STARTDATE + espan; 

    struct tm *localTime = localtime(&numDateTime); 
 
    /*make Sunday be the first day of a week */
    d->daynuminweek=((long)localTime->tm_wday+1)%7+1;
    d->monthnuminyear=(long)localTime->tm_mon+1;
#if __GNUC__ >= 8
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wstringop-truncation"
#endif
    strncpy(d->dayofweek, weekday_names[d->daynuminweek-1],D_DAYWEEK_LEN+1);
    strncpy(d->month,month_names[d->monthnuminyear-1],D_MONTH_LEN+1);
#if __GNUC__ >= 8
#pragma GCC diagnostic pop
#endif
    d->year=(long)localTime->tm_year + 1900;
    d->daynuminmonth=(long)localTime->tm_mday;
    d->yearmonthnum=d->year * 100 + d->monthnuminyear;

    sprintf(d->yearmonth,"%.3s%d",d->month,d->year);
    sprintf(d->date,"%s %d, %d",d->month,d->daynuminmonth,d->year);
    
    d->datekey = d->year*10000+d->monthnuminyear*100+ d->daynuminmonth; 

    d->daynuminyear=(int)localTime->tm_yday+1;
    d->weeknuminyear = d->daynuminyear/7 + 1;
    
    if(d->daynuminweek ==7){
	d->lastdayinweekfl[0]='1';
    }
    else{
	d->lastdayinweekfl[0]='0';
    }
    d->lastdayinweekfl[1]='\0';

    if(is_last_day_in_month(d->year,d->monthnuminyear,d->daynuminmonth)==1){
	d->lastdayinmonthfl[0]= '1';
    }else{
	d->lastdayinmonthfl[0]= '0';
    }
    d->lastdayinmonthfl[1]='\0';
 
    if(d->daynuminweek!=1 && d->daynuminweek!=7){
	d->weekdayfl[0]='1';
    }
    else{
	d->weekdayfl[0]='0';
    }
    
    d->weekdayfl[1]='\0';

    gen_season(d->sellingseason,d->monthnuminyear,d->daynuminmonth);
    d->slen = strlen(d->sellingseason);
    gen_holiday_fl(d->holidayfl,d->monthnuminyear,d->daynuminmonth);    
    return (0);
}